

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_mol.cpp
# Opt level: O1

void MOL::ComputeSyncAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *ucorr,MultiFab *vcorr,MultiFab *wcorr,
               MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,int edge_comp,bool known_edgestate,
               MultiFab *xfluxes,MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               Geometry *geom,bool is_velocity)

{
  int *piVar1;
  int i;
  long lVar2;
  DataAllocator arena;
  int iVar3;
  long lVar4;
  undefined4 in_register_00000034;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  long local_4f8;
  Box local_4ec;
  FabArray<amrex::FArrayBox> *local_4d0;
  undefined8 local_4c8;
  long local_4c0;
  long local_4b8;
  Array4<const_double> v;
  Array4<const_double> u;
  Box tmpbox;
  FArrayBox tmpfab;
  Array4<const_double> local_380;
  Array4<const_double> w;
  Elixir eli;
  Array4<double> zed;
  Array4<double> yed;
  Array4<double> xed;
  Array4<double> fz;
  Array4<double> fy;
  Array4<double> fx;
  MFIter mfi;
  MFItInfo mfi_info;
  Array4<const_double> wc;
  Array4<const_double> vc;
  Array4<const_double> uc;
  
  local_4c8 = CONCAT44(in_register_00000034,aofs_comp);
  local_4d0 = &state->super_FabArray<amrex::FArrayBox>;
  if ((state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < state_comp + ncomp) {
    amrex::Assert_host("state.nComp() >= state_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xa4,(char *)0x0);
  }
  if ((aofs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < (int)local_4c8 + ncomp) {
    amrex::Assert_host("aofs.nComp() >= aofs_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xa5,(char *)0x0);
  }
  iVar3 = edge_comp + ncomp;
  if ((xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar3) {
    amrex::Assert_host("xedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xa6,(char *)0x0);
  }
  if ((yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar3) {
    amrex::Assert_host("yedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xa7,(char *)0x0);
  }
  if ((zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar3) {
    amrex::Assert_host("zedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xa8,(char *)0x0);
  }
  iVar3 = fluxes_comp + ncomp;
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar3) {
    amrex::Assert_host("xfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xa9,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar3) {
    amrex::Assert_host("yfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xaa,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar3) {
    amrex::Assert_host("zfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xab,(char *)0x0);
  }
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("xfluxes.nGrow() == xedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xac,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("yfluxes.nGrow() == yedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xad,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("zfluxes.nGrow() == zedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xae,(char *)0x0);
  }
  if ((!known_edgestate) &&
     ((((FabArray<amrex::FArrayBox> *)&local_4d0->super_FabArrayBase)->super_FabArrayBase).n_grow.
      vect[0] < (xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] + 2)) {
    amrex::Assert_host("state.nGrow() >= xedge.nGrow()+2",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/MOL/hydro_mol.cpp"
                       ,0xb3,(char *)0x0);
  }
  mfi_info.num_streams = amrex::Gpu::Device::max_gpu_streams;
  mfi_info.do_tiling = true;
  mfi_info.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  mfi_info.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  mfi_info.tilesize.vect[2] = DAT_0083cec0;
  mfi_info.dynamic = true;
  mfi_info.device_sync = true;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)aofs,&mfi_info);
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      amrex::MFIter::tilebox(&local_4ec,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&fx,&xfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&fy,&yfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&fz,&zfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&xed,&xedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&yed,&yedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&zed,&zedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&uc,&ucorr->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&vc,&vcorr->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&wc,&wcorr->super_FabArray<amrex::FArrayBox>,&mfi);
      if (!known_edgestate) {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&tmpfab,local_4d0,&mfi,state_comp);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&u,&umac->super_FabArray<amrex::FArrayBox>,&mfi);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&v,&vmac->super_FabArray<amrex::FArrayBox>,&mfi);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&w,&wmac->super_FabArray<amrex::FArrayBox>,&mfi);
        ComputeEdgeState(&local_4ec,&xed,&yed,&zed,(Array4<const_double> *)&tmpfab,ncomp,&u,&v,&w,
                         &geom->domain,bcs,d_bcrec_ptr,is_velocity);
      }
      tmpbox.bigend.vect[2] = local_4ec.bigend.vect[2];
      lVar2 = 0;
      do {
        if ((local_4ec.btype.itype >> ((uint)lVar2 & 0x1f) & 1) == 0) {
          piVar1 = tmpbox.bigend.vect + lVar2;
          *piVar1 = *piVar1 + 1;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      tmpbox.btype.itype = 7;
      amrex::FArrayBox::FArrayBox(&tmpfab,&tmpbox,ncomp * 3,true,false,(Arena *)0x0);
      arena = tmpfab.super_BaseFab<double>.super_DataAllocator;
      if (tmpfab.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        arena.m_arena = amrex::The_Arena();
      }
      amrex::Gpu::Elixir::Elixir(&eli,(void *)0x0,arena.m_arena);
      u.begin.x = tmpfab.super_BaseFab<double>.domain.smallend.vect[0];
      u.begin.y = tmpfab.super_BaseFab<double>.domain.smallend.vect[1];
      u.p = tmpfab.super_BaseFab<double>.dptr;
      u.jstride = ((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[0] -
                  (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
      u.kstride = (((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
                  (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[1]) * u.jstride;
      u.nstride = (((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
                  (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[2]) * u.kstride;
      u.begin.z = tmpfab.super_BaseFab<double>.domain.smallend.vect[2];
      u.end._0_8_ = (long)tmpfab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
                    (long)tmpfab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
      u.end.z = (int)((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
      u.ncomp = tmpfab.super_BaseFab<double>.nvar;
      v.p = xed.p;
      v.jstride = xed.jstride;
      v.kstride = xed.kstride;
      v.nstride = xed.nstride;
      v.begin.z = xed.begin.z;
      v.begin.x = xed.begin.x;
      v.begin.y = xed.begin.y;
      v.end.z = xed.end.z;
      v.end.x = xed.end.x;
      v.end.y = xed.end.y;
      v.ncomp = xed.ncomp;
      w.p = yed.p;
      w.jstride = yed.jstride;
      w.kstride = yed.kstride;
      w.nstride = yed.nstride;
      w.begin.z = yed.begin.z;
      w.begin.x = yed.begin.x;
      w.begin.y = yed.begin.y;
      w.end.z = yed.end.z;
      w.end.x = yed.end.x;
      w.end.y = yed.end.y;
      w.ncomp = yed.ncomp;
      local_380.p = zed.p;
      local_380.jstride = zed.jstride;
      local_380.kstride = zed.kstride;
      local_380.nstride = zed.nstride;
      local_380.begin.z = zed.begin.z;
      local_380.begin.x = zed.begin.x;
      local_380.begin.y = zed.begin.y;
      local_380.end.z = zed.end.z;
      local_380.end.x = zed.end.x;
      local_380.end.y = zed.end.y;
      local_380.ncomp = zed.ncomp;
      HydroUtils::ComputeFluxes(&local_4ec,&fx,&fy,&fz,&uc,&vc,&wc,&v,&w,&local_380,geom,ncomp,true)
      ;
      v.p = fx.p;
      v.jstride = fx.jstride;
      v.kstride = fx.kstride;
      v.nstride = fx.nstride;
      v.begin.z = fx.begin.z;
      v.begin.x = fx.begin.x;
      v.begin.y = fx.begin.y;
      v.end.z = fx.end.z;
      v.end.x = fx.end.x;
      v.end.y = fx.end.y;
      v.ncomp = fx.ncomp;
      w.p = fy.p;
      w.jstride = fy.jstride;
      w.kstride = fy.kstride;
      w.nstride = fy.nstride;
      w.begin.z = fy.begin.z;
      w.begin.x = fy.begin.x;
      w.begin.y = fy.begin.y;
      w.end.z = fy.end.z;
      w.end.x = fy.end.x;
      w.end.y = fy.end.y;
      w.ncomp = fy.ncomp;
      local_380.p = fz.p;
      local_380.jstride = fz.jstride;
      local_380.kstride = fz.kstride;
      local_380.nstride = fz.nstride;
      local_380.begin.z = fz.begin.z;
      local_380.begin.x = fz.begin.x;
      local_380.begin.y = fz.begin.y;
      local_380.end.z = fz.end.z;
      local_380.end.x = fz.end.x;
      local_380.end.y = fz.end.y;
      local_380.ncomp = fz.ncomp;
      HydroUtils::ComputeDivergence
                (&local_4ec,(Array4<double> *)&u,&v,&w,&local_380,ncomp,geom,-1.0,true);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&v,&aofs->super_FabArray<amrex::FArrayBox>,&mfi,(int)local_4c8);
      if (0 < ncomp) {
        lVar2 = (long)local_4ec.smallend.vect[1];
        local_4f8 = (lVar2 - v.begin.y) * v.jstride * 8 + (long)local_4ec.smallend.vect[0] * 8 +
                    (long)v.begin.x * -8 + (long)v.p;
        lVar4 = (lVar2 - u.begin.y) * u.jstride * 8 + (long)local_4ec.smallend.vect[0] * 8 +
                (long)u.begin.x * -8 + (long)u.p;
        local_4b8 = u.kstride * 8;
        local_4c0 = -(long)u.begin.z;
        uVar6 = 0;
        do {
          iVar3 = local_4ec.smallend.vect[2];
          if (local_4ec.smallend.vect[2] <= local_4ec.bigend.vect[2]) {
            do {
              if (local_4ec.smallend.vect[1] <= local_4ec.bigend.vect[1]) {
                lVar7 = ((long)iVar3 - (long)v.begin.z) * v.kstride * 8 + local_4f8;
                lVar5 = (iVar3 + local_4c0) * local_4b8 + lVar4;
                lVar8 = lVar2;
                do {
                  if (local_4ec.smallend.vect[0] <= local_4ec.bigend.vect[0]) {
                    lVar9 = 0;
                    do {
                      *(double *)(lVar7 + lVar9 * 8) =
                           *(double *)(lVar7 + lVar9 * 8) - *(double *)(lVar5 + lVar9 * 8);
                      lVar9 = lVar9 + 1;
                    } while ((local_4ec.bigend.vect[0] - local_4ec.smallend.vect[0]) + 1 !=
                             (int)lVar9);
                  }
                  lVar8 = lVar8 + 1;
                  lVar7 = lVar7 + v.jstride * 8;
                  lVar5 = lVar5 + u.jstride * 8;
                } while (local_4ec.bigend.vect[1] + 1 != (int)lVar8);
              }
              bVar10 = iVar3 != local_4ec.bigend.vect[2];
              iVar3 = iVar3 + 1;
            } while (bVar10);
          }
          uVar6 = uVar6 + 1;
          local_4f8 = local_4f8 + v.nstride * 8;
          lVar4 = lVar4 + u.nstride * 8;
        } while (uVar6 != (uint)ncomp);
      }
      amrex::Gpu::Device::streamSynchronize();
      amrex::Gpu::Elixir::~Elixir(&eli);
      tmpfab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00837b90;
      amrex::BaseFab<double>::clear(&tmpfab.super_BaseFab<double>);
      amrex::MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  amrex::MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
MOL::ComputeSyncAofs ( MultiFab& aofs, int aofs_comp, int ncomp,
                       MultiFab const& state, int state_comp,
                       AMREX_D_DECL( MultiFab const& umac,
                                     MultiFab const& vmac,
                                     MultiFab const& wmac),
                       AMREX_D_DECL( MultiFab const& ucorr,
                                     MultiFab const& vcorr,
                                     MultiFab const& wcorr),
                       AMREX_D_DECL( MultiFab& xedge,
                                     MultiFab& yedge,
                                     MultiFab& zedge),
                       int  edge_comp,
                       bool known_edgestate,
                       AMREX_D_DECL( MultiFab& xfluxes,
                                     MultiFab& yfluxes,
                                     MultiFab& zfluxes),
                       int fluxes_comp,
                       Vector<BCRec> const& bcs,
                       BCRec  const* d_bcrec_ptr,
                       Geometry const&  geom,
                       const bool is_velocity)

{
    BL_PROFILE("MOL::ComputeSyncAofs()");

    bool fluxes_are_area_weighted = true;

    AMREX_ALWAYS_ASSERT(state.nComp() >= state_comp + ncomp);
    AMREX_ALWAYS_ASSERT(aofs.nComp()  >= aofs_comp  + ncomp);
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zedge.nComp() >= edge_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zfluxes.nComp() >= fluxes_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nGrow() == xedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(yfluxes.nGrow() == yedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(zfluxes.nGrow() == zedge.nGrow()););

    // To compute edge states, need at least 2 more ghost cells in state than in
    //  xedge
    if ( !known_edgestate ) {
        AMREX_ALWAYS_ASSERT(state.nGrow() >= xedge.nGrow()+2);
    }

    Box  const& domain = geom.Domain();

    MFItInfo mfi_info;

    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        AMREX_D_TERM( Array4<Real> fx = xfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fy = yfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( Array4<Real> xed = xedge.array(mfi,edge_comp);,
                      Array4<Real> yed = yedge.array(mfi,edge_comp);,
                      Array4<Real> zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( Array4<Real const> uc = ucorr.const_array(mfi);,
                      Array4<Real const> vc = vcorr.const_array(mfi);,
                      Array4<Real const> wc = wcorr.const_array(mfi););

        // Compute edge state if needed
        if (!known_edgestate)
        {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                          Array4<Real const> v = vmac.const_array(mfi);,
                          Array4<Real const> w = wmac.const_array(mfi););

            ComputeEdgeState( bx, AMREX_D_DECL( xed, yed, zed ), q, ncomp,
                              AMREX_D_DECL( u, v, w ), domain, bcs, d_bcrec_ptr,
                              is_velocity);

        }

        // Temporary divergence
        Box tmpbox = amrex::surroundingNodes(bx);
        int tmpcomp = ncomp*AMREX_SPACEDIM;
        FArrayBox tmpfab(tmpbox, tmpcomp);
        Elixir eli = tmpfab.elixir();
        Array4<Real> divtmp_arr = tmpfab.array();

        // Compute fluxes
        HydroUtils::ComputeFluxes( bx,
                                   AMREX_D_DECL(fx,fy,fz),
                                   AMREX_D_DECL(uc,vc,wc),
                                   AMREX_D_DECL(xed,yed,zed),
                                   geom, ncomp, fluxes_are_area_weighted );

        // Compute divergence
        Real mult = -1.0;
        HydroUtils::ComputeDivergence( bx, divtmp_arr,
                                       AMREX_D_DECL(fx,fy,fz),
                                       ncomp, geom,
                                       mult, fluxes_are_area_weighted);

        // Sum contribution to sync aofs
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, divtmp_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) += -divtmp_arr( i, j, k, n ); });

        Gpu::streamSynchronize();  // otherwise we might be using too much memory
    }
}